

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O1

void __thiscall duckdb::OrderMergeEvent::Schedule(OrderMergeEvent *this)

{
  OrderGlobalSinkState *state;
  PhysicalOperator *op_p;
  int32_t val;
  Pipeline *this_00;
  TaskScheduler *this_01;
  unsigned_long uVar1;
  PhysicalOrderMergeTask *this_02;
  enable_shared_from_this<duckdb::Task> *object;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> merge_tasks;
  _Head_base<0UL,_duckdb::PhysicalOrderMergeTask_*,_false> local_b0;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_a8;
  enable_shared_from_this<duckdb::Event> local_88;
  shared_ptr<duckdb::Event,_true> local_78;
  enable_shared_from_this<duckdb::Event> *local_68;
  ClientContext *local_60;
  Task *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_48;
  
  this_00 = shared_ptr<duckdb::Pipeline,_true>::operator->
                      (&(this->super_BasePipelineEvent).pipeline);
  local_60 = Pipeline::GetClientContext(this_00);
  this_01 = TaskScheduler::GetScheduler(local_60);
  val = TaskScheduler::NumberOfThreads(this_01);
  uVar1 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar1 != 0) {
    local_68 = &(this->super_BasePipelineEvent).super_Event.
                super_enable_shared_from_this<duckdb::Event>;
    do {
      enable_shared_from_this<duckdb::Event>::shared_from_this(&local_88);
      state = this->gstate;
      op_p = this->op;
      this_02 = (PhysicalOrderMergeTask *)operator_new(0x60);
      local_78.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_88.__weak_this_.internal.
           super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_88.__weak_this_.internal.
              super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_88.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_88.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      PhysicalOrderMergeTask::PhysicalOrderMergeTask(this_02,&local_78,local_60,state,op_p);
      local_b0._M_head_impl = this_02;
      if (local_78.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      ::std::__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<duckdb::PhysicalOrderMergeTask,std::default_delete<duckdb::PhysicalOrderMergeTask>,void>
                ((__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 (unique_ptr<duckdb::PhysicalOrderMergeTask,_std::default_delete<duckdb::PhysicalOrderMergeTask>_>
                  *)&local_b0);
      object = &local_58->super_enable_shared_from_this<duckdb::Task>;
      if (local_58 == (Task *)0x0) {
        object = (enable_shared_from_this<duckdb::Task> *)0x0;
      }
      shared_ptr<duckdb::Task,_true>::__enable_weak_this<duckdb::Task,_duckdb::Task,_0>
                ((shared_ptr<duckdb::Task,_true> *)&local_58,object,local_58);
      ::std::
      vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
      ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
                ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                  *)&local_a8,(shared_ptr<duckdb::Task,_true> *)&local_58);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      if (local_b0._M_head_impl != (PhysicalOrderMergeTask *)0x0) {
        (*((local_b0._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
      }
      local_b0._M_head_impl = (PhysicalOrderMergeTask *)0x0;
      if (local_88.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.__weak_this_.internal.
                   super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_a8.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_a8.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_a8.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)this,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

void Schedule() override {
		auto &context = pipeline->GetClientContext();

		// Schedule tasks equal to the number of threads, which will each merge multiple partitions
		auto &ts = TaskScheduler::GetScheduler(context);
		auto num_threads = NumericCast<idx_t>(ts.NumberOfThreads());

		vector<shared_ptr<Task>> merge_tasks;
		for (idx_t tnum = 0; tnum < num_threads; tnum++) {
			merge_tasks.push_back(make_uniq<PhysicalOrderMergeTask>(shared_from_this(), context, gstate, op));
		}
		SetTasks(std::move(merge_tasks));
	}